

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_XYZfunctions.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChFunctionPosition_XYZfunctions::Get_p_ds
          (ChVector<double> *__return_storage_ptr__,ChFunctionPosition_XYZfunctions *this,double s)

{
  double dVar1;
  double dVar2;
  
  dVar1 = s;
  (*((this->px).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar2 = s;
  (*((this->py).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  (*((this->pz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  __return_storage_ptr__->m_data[0] = dVar1;
  __return_storage_ptr__->m_data[1] = dVar2;
  __return_storage_ptr__->m_data[2] = s;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChFunctionPosition_XYZfunctions::Get_p_ds(double s) const {
	return ChVector<>(
		px->Get_y_dx(s), 
		py->Get_y_dx(s), 
		pz->Get_y_dx(s));
}